

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O1

void dlib::
     matrix_assign_big<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
               (assignable_ptr_matrix<float> *dest,
               matrix_exp<dlib::matrix_op<dlib::op_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
               *src)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float *pfVar9;
  long lVar10;
  float fVar11;
  
  plVar1 = *(long **)src;
  lVar2 = plVar1[1];
  if (0 < lVar2) {
    lVar3 = plVar1[2];
    pfVar9 = dest->ptr;
    lVar4 = dest->width;
    lVar8 = 0;
    lVar10 = 0;
    do {
      if (0 < lVar3) {
        lVar5 = plVar1[3];
        lVar6 = *plVar1;
        lVar7 = 0;
        do {
          fVar11 = expf(*(float *)(lVar5 * lVar8 + lVar6 + lVar7 * 4));
          pfVar9[lVar7] = fVar11;
          lVar7 = lVar7 + 1;
        } while (lVar3 != lVar7);
      }
      lVar10 = lVar10 + 1;
      pfVar9 = pfVar9 + lVar4;
      lVar8 = lVar8 + 4;
    } while (lVar10 != lVar2);
  }
  return;
}

Assistant:

void matrix_assign_big (
        matrix_dest_type& dest,
        const matrix_exp<src_exp>& src
    )
    {
        matrix_assign_default(dest,src);
    }